

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Player::move(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Player *this,int a,int b)

{
  initializer_list<int> __l;
  int local_40;
  int local_3c;
  iterator local_38;
  undefined8 local_30;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int b_local;
  int a_local;
  Player *this_local;
  vector<int,_std::allocator<int>_> *vec;
  
  local_21 = 0;
  local_20 = b;
  local_1c = a;
  _b_local = this;
  this_local = (Player *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  this->x = local_1c + this->x;
  this->y = local_20 + this->y;
  if (this->x < 0) {
    this->x = 0;
  }
  else if (this->_RANGE + -1 < this->x) {
    this->x = this->_RANGE + -1;
  }
  if (this->y < 0) {
    this->y = 0;
  }
  else if (this->_RANGE + -1 < this->y) {
    this->y = this->_RANGE + -1;
  }
  local_40 = this->x;
  local_3c = this->y;
  local_38 = &local_40;
  local_30 = 2;
  __l._M_len = 2;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::operator=(__return_storage_ptr__,__l);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Player::move(int a, int b)
{
    std::vector<int> vec;

    this->x += a;
    //std::cout << "x is " << this->x;

    this->y += b;
    //std::cout << " y is " << this->y<<std::endl;

    // this->z += c;
    //  std::cout<<" z is "<<this->z<<std::endl;

    if (this->x < 0)
    {
        this->x = 0;
    }
    else if (this->x > (_RANGE - 1))
    {
        this->x = _RANGE - 1; //Looks good
    }
    if (this->y < 0)
    {
        this->y = 0;
    }
    else if (this->y > (_RANGE - 1))
    {
        this->y = _RANGE - 1;
    }
    /**
    if (this->z < 0)
    {
        this->z = 0;
    }
    else if (this->z > (_RANGE - 1))
    {
        this->z = _RANGE - 1;
    }
    std::cout<<" x is "<<this->x;
    std::cout<<" y is "<<this->y;
    std::cout<<" z is "<<this->z<<std::endl;
    **/
    vec = {this->x, this->y};
    return vec;
}